

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ApiTokenize(Fts5Context *pCtx,char *pText,int nText,void *pUserData,
                   _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  long lVar1;
  Fts5Config *pConfig;
  int iVar2;
  
  lVar1 = *(long *)pCtx;
  pConfig = *(Fts5Config **)(lVar1 + 0x18);
  (pConfig->t).pLocale = (char *)0x0;
  (pConfig->t).nLocale = 0;
  iVar2 = sqlite3Fts5Tokenize(pConfig,8,pText,nText,pUserData,xToken);
  lVar1 = *(long *)(lVar1 + 0x18);
  *(undefined8 *)(lVar1 + 0xa8) = 0;
  *(undefined4 *)(lVar1 + 0xb0) = 0;
  return iVar2;
}

Assistant:

static int fts5ApiTokenize(
  Fts5Context *pCtx,
  const char *pText, int nText,
  void *pUserData,
  int (*xToken)(void*, int, const char*, int, int, int)
){
  return fts5ApiTokenize_v2(pCtx, pText, nText, 0, 0, pUserData, xToken);
}